

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

string * pbrt::RemoveExtension(string *filename)

{
  ulong uVar1;
  string *in_RSI;
  string *in_RDI;
  string ext;
  string *f;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  string *this;
  string *in_stack_ffffffffffffff58;
  path *in_stack_ffffffffffffff60;
  undefined8 local_98;
  undefined8 local_78;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  string local_30 [32];
  string *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  filesystem::path::path(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  filesystem::path::extension_abi_cxx11_
            ((path *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  filesystem::path::~path((path *)0x86a5b9);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI,local_10);
    std::__cxx11::string::end();
    std::__cxx11::string::size();
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this,(difference_type)in_RDI);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this,(difference_type)in_RDI);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI,in_stack_ffffffffffffff38);
    std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI,in_stack_ffffffffffffff38);
    std::__cxx11::string::erase(in_RDI,local_78,local_98);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_10);
  }
  std::__cxx11::string::~string(local_30);
  return this;
}

Assistant:

std::string RemoveExtension(const std::string &filename) {
    std::string ext = filesystem::path(filename).extension();
    if (ext.empty())
        return filename;
    std::string f = filename;
    f.erase(f.end() - ext.size() - 1, f.end());
    return f;
}